

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<float> * __thiscall Imath_2_5::Matrix44<float>::invert(Matrix44<float> *this,bool singExc)

{
  Matrix44<float> local_50;
  
  inverse(&local_50,this,singExc);
  operator=(this,&local_50);
  return this;
}

Assistant:

const Matrix44<T> &
Matrix44<T>::invert (bool singExc)
{
    *this = inverse (singExc);
    return *this;
}